

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textbox_base.cpp
# Opt level: O1

void __thiscall cppurses::detail::Textbox_base::scroll_up(Textbox_base *this,size_t n)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  Point position;
  
  if ((this->super_Text_display).top_line_ != 0) {
    Text_display::scroll_up(&this->super_Text_display,n);
    uVar4 = n + (this->super_Text_display).super_Widget.cursor.position_.y;
    sVar3 = (this->super_Text_display).super_Widget.outer_height_;
    sVar1 = Border_offset::north((Widget *)this);
    sVar2 = Border_offset::south((Widget *)this);
    if (~(sVar2 + sVar1) + sVar3 < uVar4) {
      sVar3 = (this->super_Text_display).super_Widget.outer_height_;
      sVar1 = Border_offset::north((Widget *)this);
      sVar2 = Border_offset::south((Widget *)this);
      uVar4 = ~(sVar2 + sVar1) + sVar3;
    }
    position.y = uVar4;
    position.x = (this->super_Text_display).super_Widget.cursor.position_.x;
    sVar3 = Text_display::index_at(&this->super_Text_display,position);
    set_cursor(this,sVar3);
    return;
  }
  return;
}

Assistant:

void Textbox_base::scroll_up(std::size_t n) {
    if (this->top_line() == 0) {
        return;
    }
    Text_display::scroll_up(n);
    auto y = this->cursor.y() + n;
    if (y > this->height() - 1) {
        y = this->height() - 1;
    }
    this->set_cursor({this->cursor.x(), y});
}